

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_atomic_func_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,char *op,Op opcode,
          uint32_t mem_order_1,uint32_t mem_order_2,bool has_mem_order_2,uint32_t obj,uint32_t op1,
          bool op1_is_pointer,bool op1_is_literal,uint32_t op2)

{
  bool bVar1;
  bool bVar2;
  uint32_t id;
  int iVar3;
  SPIRType *type_00;
  CompilerError *pCVar4;
  char *pcVar5;
  BaseType target_type;
  bool local_7cc;
  bool local_7ca;
  bool local_7c9;
  undefined1 local_760 [40];
  string local_738 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718 [39];
  allocator local_6f1;
  string local_6f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0 [32];
  undefined1 local_6b0 [64];
  undefined1 local_670 [40];
  string local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [39];
  allocator local_601;
  string local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [32];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  spirv_cross local_540 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520 [39];
  allocator local_4f9;
  string local_4f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  undefined1 local_470 [64];
  undefined1 local_430 [32];
  undefined1 local_410 [64];
  spirv_cross local_3d0 [32];
  undefined1 local_3b0 [64];
  undefined1 local_370 [64];
  undefined1 local_330 [64];
  undefined1 local_2f0 [40];
  string local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  spirv_cross local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [38];
  bool local_222;
  bool local_221;
  bool check_discard;
  __node_base _Stack_220;
  bool is_atomic_compare_exchange_strong;
  SPIRType *res_type;
  string local_210 [32];
  SPIRVariable *local_1f0;
  SPIRVariable *var;
  SPIRType remapped_type;
  string local_90 [32];
  BaseType local_70;
  BaseType expected_type;
  SPIRType *local_60;
  SPIRType *type;
  string exp;
  bool op1_is_literal_local;
  bool op1_is_pointer_local;
  bool has_mem_order_2_local;
  uint32_t mem_order_1_local;
  Op opcode_local;
  char *op_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  bVar1 = op1_is_literal;
  local_7c9 = op1_is_pointer;
  ::std::__cxx11::string::string((string *)&type);
  type_00 = Compiler::expression_type((Compiler *)this,obj);
  local_60 = Compiler::get_pointee_type((Compiler *)this,type_00);
  local_70 = *(BaseType *)&(local_60->super_IVariant).field_0xc;
  if ((opcode == OpAtomicUMax) || (opcode == OpAtomicUMin)) {
    local_70 = to_unsigned_basetype(local_60->width);
  }
  else if ((opcode == OpAtomicSMax) || (opcode == OpAtomicSMin)) {
    local_70 = to_signed_basetype(local_60->width);
  }
  if (local_60->width == 0x40) {
    remapped_type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_90,"MSL currently does not support 64-bit atomics.",
               (allocator *)((long)&remapped_type.member_name_cache._M_h._M_single_bucket + 7));
    CompilerError::CompilerError(pCVar4,(string *)local_90);
    remapped_type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  SPIRType::SPIRType((SPIRType *)&var,local_60);
  remapped_type.super_IVariant._vptr_IVariant._4_4_ = local_70;
  local_1f0 = Compiler::maybe_get_backing_variable((Compiler *)this,obj);
  if (local_1f0 == (SPIRVariable *)0x0) {
    res_type._6_1_ = 1;
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_210,"No backing variable for atomic operation.",
               (allocator *)((long)&res_type + 7));
    CompilerError::CompilerError(pCVar4,(string *)local_210);
    res_type._6_1_ = 0;
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_1f0->super_IVariant).field_0xc);
  _Stack_220._M_nxt = (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  local_7c9 = local_7c9 && op1 != 0;
  local_221 = local_7c9;
  local_7ca = false;
  if (opcode != OpAtomicLoad) {
    bVar2 = needs_frag_discard_checks(this);
    local_7ca = false;
    if (bVar2) {
      if (((*(StorageClass *)(_Stack_220._M_nxt + 0x10) != StorageClassUniformConstant) ||
          (local_7cc = true, *(int *)((ID *)(_Stack_220._M_nxt + 1) + 1) != 0x10)) &&
         (local_7cc = true, local_1f0->storage != StorageClassStorageBuffer)) {
        local_7cc = local_1f0->storage == StorageClassUniform;
      }
      local_7ca = local_7cc;
    }
  }
  local_222 = local_7ca;
  if (local_7ca != false) {
    if ((local_221 & 1U) == 0) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_288,this,0x17,1);
      join<char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
                (local_268,(char (*) [3])0x5fdfc6,local_288,(char (*) [4])0x5f6433);
      ::std::__cxx11::string::operator=((string *)&type,(string *)local_268);
      ::std::__cxx11::string::~string((string *)local_268);
      ::std::__cxx11::string::~string((string *)local_288);
    }
    else {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,result_type,result_id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_248,this,0x17,1);
      CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [6])"if (!",local_248,(char (*) [2])0x5eaa1a);
      ::std::__cxx11::string::~string((string *)local_248);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    }
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2c8,op,(allocator *)(local_2f0 + 0x27));
  ::std::operator+(local_2a8,(char *)local_2c8);
  ::std::__cxx11::string::operator+=((string *)&type,(string *)local_2a8);
  ::std::__cxx11::string::~string((string *)local_2a8);
  ::std::__cxx11::string::~string(local_2c8);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_2f0 + 0x27));
  ::std::__cxx11::string::operator+=((string *)&type,"(");
  if ((*(StorageClass *)(_Stack_220._M_nxt + 0x10) == StorageClassUniformConstant) &&
     (*(int *)((ID *)(_Stack_220._M_nxt + 1) + 1) == 0x10)) {
    ::std::__cxx11::string::operator+=((string *)&type,"device");
  }
  else {
    get_argument_address_space_abi_cxx11_((CompilerMSL *)local_2f0,(SPIRVariable *)this);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)local_2f0);
    ::std::__cxx11::string::~string((string *)local_2f0);
  }
  ::std::__cxx11::string::operator+=((string *)&type," atomic_");
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_330 + 0x20,this,&var,0);
  ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_330 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_330 + 0x20));
  ::std::__cxx11::string::operator+=((string *)&type,"*)");
  ::std::__cxx11::string::operator+=((string *)&type,"&");
  bVar2 = SUB41(obj,0);
  target_type = (BaseType)this;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_330,target_type,bVar2);
  ::std::__cxx11::string::operator+=((string *)&type,(string *)local_330);
  ::std::__cxx11::string::~string((string *)local_330);
  if ((local_221 & 1U) == 0) {
    iVar3 = strcmp(op,"atomic_compare_exchange_weak_explicit");
    if (iVar3 == 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2669,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (op1 != 0) {
      if (bVar1) {
        join<char_const(&)[3],unsigned_int&>(local_540,(char (*) [3])0x5fe6df,&op1);
        ::std::__cxx11::string::operator+=((string *)&type,(string *)local_540);
        ::std::__cxx11::string::~string((string *)local_540);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_((CompilerGLSL *)local_580,target_type,local_70);
        ::std::operator+(local_580 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5fe6df);
        ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_580 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_580 + 0x20));
        ::std::__cxx11::string::~string((string *)local_580);
      }
    }
    if (op2 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_5c0,target_type,SUB41(op2,0));
      ::std::operator+(local_5c0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5fe6df
                      );
      ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_5c0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_5c0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_5c0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_600,", ",&local_601);
    get_memory_order(this,mem_order_1);
    ::std::operator+(local_5e0,(char *)local_600);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)local_5e0);
    ::std::__cxx11::string::~string((string *)local_5e0);
    ::std::__cxx11::string::~string(local_600);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_601);
    if (has_mem_order_2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_648,", ",(allocator *)(local_670 + 0x27));
      get_memory_order(this,mem_order_2);
      ::std::operator+(local_628,(char *)local_648);
      ::std::__cxx11::string::operator+=((string *)&type,(string *)local_628);
      ::std::__cxx11::string::~string((string *)local_628);
      ::std::__cxx11::string::~string(local_648);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_670 + 0x27));
    }
    ::std::__cxx11::string::operator+=((string *)&type,")");
    if ((local_222 & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)&type," : ");
      iVar3 = strcmp(op,"atomic_store_explicit");
      if (iVar3 == 0) {
        ::std::__cxx11::string::operator+=((string *)&type,"((void)0)");
      }
      else {
        ::std::__cxx11::string::operator+=((string *)&type,"atomic_load_explicit(");
        ::std::__cxx11::string::operator+=((string *)&type,"(");
        if ((*(StorageClass *)(_Stack_220._M_nxt + 0x10) == StorageClassUniformConstant) &&
           (*(int *)((ID *)(_Stack_220._M_nxt + 1) + 1) == 0x10)) {
          ::std::__cxx11::string::operator+=((string *)&type,"device");
        }
        else {
          get_argument_address_space_abi_cxx11_((CompilerMSL *)local_670,(SPIRVariable *)this);
          ::std::__cxx11::string::operator+=((string *)&type,(string *)local_670);
          ::std::__cxx11::string::~string((string *)local_670);
        }
        ::std::__cxx11::string::operator+=((string *)&type," atomic_");
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_6b0 + 0x20,this,&var,0);
        ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_6b0 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_6b0 + 0x20));
        ::std::__cxx11::string::operator+=((string *)&type,"*)");
        ::std::__cxx11::string::operator+=((string *)&type,"&");
        CompilerGLSL::to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_6b0,target_type,bVar2)
        ;
        ::std::__cxx11::string::operator+=((string *)&type,(string *)local_6b0);
        ::std::__cxx11::string::~string((string *)local_6b0);
        if (has_mem_order_2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_6f0,", ",&local_6f1);
          get_memory_order(this,mem_order_2);
          ::std::operator+(local_6d0,(char *)local_6f0);
          ::std::__cxx11::string::operator+=((string *)&type,(string *)local_6d0);
          ::std::__cxx11::string::~string((string *)local_6d0);
          ::std::__cxx11::string::~string(local_6f0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_738,", ",(allocator *)(local_760 + 0x27));
          get_memory_order(this,mem_order_1);
          ::std::operator+(local_718,(char *)local_738);
          ::std::__cxx11::string::operator+=((string *)&type,(string *)local_718);
          ::std::__cxx11::string::~string((string *)local_718);
          ::std::__cxx11::string::~string(local_738);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_760 + 0x27));
        }
        ::std::__cxx11::string::operator+=((string *)&type,")");
      }
      ::std::__cxx11::string::operator+=((string *)&type,")");
    }
    if (local_70 != *(BaseType *)&(local_60->super_IVariant).field_0xc) {
      CompilerGLSL::bitcast_expression
                ((CompilerGLSL *)local_760,(SPIRType *)this,(BaseType)local_60,
                 (string *)(ulong)local_70);
      ::std::__cxx11::string::operator=((string *)&type,(string *)local_760);
      ::std::__cxx11::string::~string((string *)local_760);
    }
    iVar3 = strcmp(op,"atomic_store_explicit");
    if (iVar3 == 0) {
      CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                 (char (*) [2])0x5e9b70);
    }
    else {
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,result_type,result_id,(string *)&type,false,false);
    }
  }
  else {
    iVar3 = strcmp(op,"atomic_compare_exchange_weak_explicit");
    if (iVar3 != 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x262f,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (op2 == 0) {
      __assert_fail("op2",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2630,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (!has_mem_order_2) {
      __assert_fail("has_mem_order_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2631,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    ::std::__cxx11::string::operator+=((string *)&type,", &");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_370 + 0x20,this,(ulong)result_id,1);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_370 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_370 + 0x20));
    ::std::__cxx11::string::operator+=((string *)&type,", ");
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_370,target_type,SUB41(op2,0));
    ::std::__cxx11::string::operator+=((string *)&type,(string *)local_370);
    ::std::__cxx11::string::~string((string *)local_370);
    ::std::__cxx11::string::operator+=((string *)&type,", ");
    pcVar5 = get_memory_order(this,mem_order_1);
    ::std::__cxx11::string::operator+=((string *)&type,pcVar5);
    ::std::__cxx11::string::operator+=((string *)&type,", ");
    pcVar5 = get_memory_order(this,mem_order_2);
    ::std::__cxx11::string::operator+=((string *)&type,pcVar5);
    ::std::__cxx11::string::operator+=((string *)&type,")");
    if ((local_222 & 1U) == 0) {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,result_type,result_id);
    }
    CompilerGLSL::statement<char_const(&)[3]>(&this->super_CompilerGLSL,(char (*) [3])"do");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_3b0 + 0x20,this,(ulong)result_id,1);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_3b0,target_type,SUB41(op1,0));
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_3b0 + 0x20),(char (*) [4])0x601511,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
               (char (*) [2])0x5e9b70);
    ::std::__cxx11::string::~string((string *)local_3b0);
    ::std::__cxx11::string::~string((string *)(local_3b0 + 0x20));
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_410 + 0x20,this,(ulong)result_id,1);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_
              ((CompilerGLSL *)local_410,target_type,SUB41(op1,0));
    join<char_const(&)[9],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              (local_3d0,(char (*) [9])"while (!",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
               (char (*) [5])" && ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_410 + 0x20),(char (*) [5])" == ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
               (char (*) [2])0x5eaa1a);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL,(string *)local_3d0);
    ::std::__cxx11::string::~string((string *)local_3d0);
    ::std::__cxx11::string::~string((string *)local_410);
    ::std::__cxx11::string::~string((string *)(local_410 + 0x20));
    if ((local_222 & 1U) != 0) {
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[5]>(&this->super_CompilerGLSL,(char (*) [5])0x5e1afc);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      ::std::__cxx11::string::operator=((string *)&type,"atomic_load_explicit(");
      ::std::__cxx11::string::operator+=((string *)&type,"(");
      if ((*(StorageClass *)(_Stack_220._M_nxt + 0x10) == StorageClassUniformConstant) &&
         (*(int *)((ID *)(_Stack_220._M_nxt + 1) + 1) == 0x10)) {
        ::std::__cxx11::string::operator+=((string *)&type,"device");
      }
      else {
        get_argument_address_space_abi_cxx11_((CompilerMSL *)local_430,(SPIRVariable *)this);
        ::std::__cxx11::string::operator+=((string *)&type,(string *)local_430);
        ::std::__cxx11::string::~string((string *)local_430);
      }
      ::std::__cxx11::string::operator+=((string *)&type," atomic_");
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_470 + 0x20,this,&var,0);
      ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_470 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_470 + 0x20));
      ::std::__cxx11::string::operator+=((string *)&type,"*)");
      ::std::__cxx11::string::operator+=((string *)&type,"&");
      CompilerGLSL::to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_470,target_type,bVar2);
      ::std::__cxx11::string::operator+=((string *)&type,(string *)local_470);
      ::std::__cxx11::string::~string((string *)local_470);
      if (has_mem_order_2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_4b0,", ",&local_4b1);
        get_memory_order(this,mem_order_2);
        ::std::operator+(local_490,(char *)local_4b0);
        ::std::__cxx11::string::operator+=((string *)&type,(string *)local_490);
        ::std::__cxx11::string::~string((string *)local_490);
        ::std::__cxx11::string::~string(local_4b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_4f8,", ",&local_4f9);
        get_memory_order(this,mem_order_1);
        ::std::operator+(local_4d8,(char *)local_4f8);
        ::std::__cxx11::string::operator+=((string *)&type,(string *)local_4d8);
        ::std::__cxx11::string::~string((string *)local_4d8);
        ::std::__cxx11::string::~string(local_4f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
      }
      ::std::__cxx11::string::operator+=((string *)&type,")");
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_520,this,(ulong)result_id,1);
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,local_520,(char (*) [4])0x601511,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                 (char (*) [2])0x5e9b70);
      ::std::__cxx11::string::~string((string *)local_520);
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  SPIRType::~SPIRType((SPIRType *)&var);
  ::std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void CompilerMSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, const char *op, Op opcode,
                                      uint32_t mem_order_1, uint32_t mem_order_2, bool has_mem_order_2, uint32_t obj, uint32_t op1,
                                      bool op1_is_pointer, bool op1_is_literal, uint32_t op2)
{
	string exp;

	auto &type = get_pointee_type(expression_type(obj));
	auto expected_type = type.basetype;
	if (opcode == OpAtomicUMax || opcode == OpAtomicUMin)
		expected_type = to_unsigned_basetype(type.width);
	else if (opcode == OpAtomicSMax || opcode == OpAtomicSMin)
		expected_type = to_signed_basetype(type.width);

	if (type.width == 64)
		SPIRV_CROSS_THROW("MSL currently does not support 64-bit atomics.");

	auto remapped_type = type;
	remapped_type.basetype = expected_type;

	auto *var = maybe_get_backing_variable(obj);
	if (!var)
		SPIRV_CROSS_THROW("No backing variable for atomic operation.");
	const auto &res_type = get<SPIRType>(var->basetype);

	bool is_atomic_compare_exchange_strong = op1_is_pointer && op1;

	bool check_discard = opcode != OpAtomicLoad && needs_frag_discard_checks() &&
	                     ((res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image) ||
	                      var->storage == StorageClassStorageBuffer || var->storage == StorageClassUniform);

	if (check_discard)
	{
		if (is_atomic_compare_exchange_strong)
		{
			// We're already emitting a CAS loop here; a conditional won't hurt.
			emit_uninitialized_temporary_expression(result_type, result_id);
			statement("if (!", builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput), ")");
			begin_scope();
		}
		else
			exp = join("(!", builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput), " ? ");
	}

	exp += string(op) + "(";
	exp += "(";
	// Emulate texture2D atomic operations
	if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
	{
		exp += "device";
	}
	else
	{
		exp += get_argument_address_space(*var);
	}

	exp += " atomic_";
	// For signed and unsigned min/max, we can signal this through the pointer type.
	// There is no other way, since C++ does not have explicit signage for atomics.
	exp += type_to_glsl(remapped_type);
	exp += "*)";

	exp += "&";
	exp += to_enclosed_expression(obj);

	if (is_atomic_compare_exchange_strong)
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") == 0);
		assert(op2);
		assert(has_mem_order_2);
		exp += ", &";
		exp += to_name(result_id);
		exp += ", ";
		exp += to_expression(op2);
		exp += ", ";
		exp += get_memory_order(mem_order_1);
		exp += ", ";
		exp += get_memory_order(mem_order_2);
		exp += ")";

		// MSL only supports the weak atomic compare exchange, so emit a CAS loop here.
		// The MSL function returns false if the atomic write fails OR the comparison test fails,
		// so we must validate that it wasn't the comparison test that failed before continuing
		// the CAS loop, otherwise it will loop infinitely, with the comparison test always failing.
		// The function updates the comparitor value from the memory value, so the additional
		// comparison test evaluates the memory value against the expected value.
		if (!check_discard)
			emit_uninitialized_temporary_expression(result_type, result_id);
		statement("do");
		begin_scope();
		statement(to_name(result_id), " = ", to_expression(op1), ";");
		end_scope_decl(join("while (!", exp, " && ", to_name(result_id), " == ", to_enclosed_expression(op1), ")"));
		if (check_discard)
		{
			end_scope();
			statement("else");
			begin_scope();
			exp = "atomic_load_explicit(";
			exp += "(";
			// Emulate texture2D atomic operations
			if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
				exp += "device";
			else
				exp += get_argument_address_space(*var);

			exp += " atomic_";
			exp += type_to_glsl(remapped_type);
			exp += "*)";

			exp += "&";
			exp += to_enclosed_expression(obj);

			if (has_mem_order_2)
				exp += string(", ") + get_memory_order(mem_order_2);
			else
				exp += string(", ") + get_memory_order(mem_order_1);

			exp += ")";

			statement(to_name(result_id), " = ", exp, ";");
			end_scope();
		}
	}
	else
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") != 0);
		if (op1)
		{
			if (op1_is_literal)
				exp += join(", ", op1);
			else
				exp += ", " + bitcast_expression(expected_type, op1);
		}
		if (op2)
			exp += ", " + to_expression(op2);

		exp += string(", ") + get_memory_order(mem_order_1);
		if (has_mem_order_2)
			exp += string(", ") + get_memory_order(mem_order_2);

		exp += ")";

		if (check_discard)
		{
			exp += " : ";
			if (strcmp(op, "atomic_store_explicit") != 0)
			{
				exp += "atomic_load_explicit(";
				exp += "(";
				// Emulate texture2D atomic operations
				if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
					exp += "device";
				else
					exp += get_argument_address_space(*var);

				exp += " atomic_";
				exp += type_to_glsl(remapped_type);
				exp += "*)";

				exp += "&";
				exp += to_enclosed_expression(obj);

				if (has_mem_order_2)
					exp += string(", ") + get_memory_order(mem_order_2);
				else
					exp += string(", ") + get_memory_order(mem_order_1);

				exp += ")";
			}
			else
				exp += "((void)0)";
			exp += ")";
		}

		if (expected_type != type.basetype)
			exp = bitcast_expression(type, expected_type, exp);

		if (strcmp(op, "atomic_store_explicit") != 0)
			emit_op(result_type, result_id, exp, false);
		else
			statement(exp, ";");
	}

	flush_all_atomic_capable_variables();
}